

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O2

void __thiscall
cmExportInstallFileGenerator::ReplaceInstallPrefix(cmExportInstallFileGenerator *this,string *input)

{
  ulong uVar1;
  
  while( true ) {
    uVar1 = std::__cxx11::string::find((char *)input,0x48b2a9);
    if (uVar1 == 0xffffffffffffffff) break;
    std::__cxx11::string::replace((ulong)input,uVar1,(char *)0x11);
  }
  return;
}

Assistant:

void
cmExportInstallFileGenerator::ReplaceInstallPrefix(std::string &input)
{
  std::string::size_type pos = 0;
  std::string::size_type lastPos = pos;

  while((pos = input.find("$<INSTALL_PREFIX>", lastPos)) != input.npos)
    {
    std::string::size_type endPos = pos + sizeof("$<INSTALL_PREFIX>") - 1;
    input.replace(pos, endPos - pos, "${_IMPORT_PREFIX}");
    lastPos = endPos;
    }
}